

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<std::error_code> __thiscall
cinatra::coro_http_client::handle_chunked<std::__cxx11::string>
          (coro_http_client *this,resp_data *data,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx)

{
  size_t *psVar1;
  undefined4 uVar2;
  char *pcVar3;
  element_type *peVar4;
  string_view *psVar5;
  undefined4 *in_RCX;
  
  peVar4 = (element_type *)operator_new(0xe8,(nothrow_t *)&std::nothrow);
  if (peVar4 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar4->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         handle_chunked<std::__cxx11::string>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar4->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handle_chunked<std::__cxx11::string>;
    *(req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      **)((long)(peVar4->parser_).headers_._M_elems + 0x88) = ctx;
    (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0x80))->name)._M_len =
         (size_t)data;
    uVar2 = *in_RCX;
    (peVar4->parser_).has_connection_ = (bool)(char)uVar2;
    (peVar4->parser_).has_close_ = (bool)(char)((uint)uVar2 >> 8);
    (peVar4->parser_).has_upgrade_ = (bool)(char)((uint)uVar2 >> 0x10);
    (peVar4->parser_).field_0x33 = (char)((uint)uVar2 >> 0x18);
    psVar5 = (string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x10);
    (peVar4->parser_).headers_._M_elems[0].name._M_len = (size_t)psVar5;
    psVar1 = (size_t *)(in_RCX + 6);
    if (*(size_t **)(in_RCX + 2) == psVar1) {
      pcVar3 = *(char **)(in_RCX + 8);
      psVar5->_M_len = *psVar1;
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 0x18) = pcVar3;
    }
    else {
      (peVar4->parser_).headers_._M_elems[0].name._M_len = (size_t)*(size_t **)(in_RCX + 2);
      ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x10))->_M_len = *psVar1;
    }
    *(char **)((long)(peVar4->parser_).headers_._M_elems + 8) = *(char **)(in_RCX + 4);
    *(size_t **)(in_RCX + 2) = psVar1;
    *(undefined8 *)(in_RCX + 4) = 0;
    *(undefined1 *)(in_RCX + 6) = 0;
    psVar5 = (string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x30);
    (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0x20))->name)._M_len =
         (size_t)psVar5;
    psVar1 = (size_t *)(in_RCX + 0xe);
    if (*(size_t **)(in_RCX + 10) == psVar1) {
      pcVar3 = *(char **)(in_RCX + 0x10);
      psVar5->_M_len = *psVar1;
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 0x38) = pcVar3;
    }
    else {
      (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0x20))->name)._M_len =
           (size_t)*(size_t **)(in_RCX + 10);
      ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x30))->_M_len = *psVar1;
    }
    *(char **)((long)(peVar4->parser_).headers_._M_elems + 0x28) = *(char **)(in_RCX + 0xc);
    *(size_t **)(in_RCX + 10) = psVar1;
    *(undefined8 *)(in_RCX + 0xc) = 0;
    *(undefined1 *)(in_RCX + 0xe) = 0;
    (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0x40))->name)._M_len =
         *(size_t *)(in_RCX + 0x12);
    (peVar4->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar4->parser_ = 0;
    (peVar4->parser_).msg_._M_len = 0;
    *(undefined1 *)&(peVar4->parser_).body_len_ = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    *(undefined1 *)((long)(peVar4->parser_).headers_._M_elems + 0x98) = 0;
  }
  return (LazyBase<std::error_code,_false>)(LazyBase<std::error_code,_false>)this;
}

Assistant:

async_simple::coro::Lazy<std::error_code> handle_chunked(
      resp_data &data, req_context<String> ctx) {
    std::error_code ec{};
    size_t size = 0;
    while (true) {
      if (std::tie(ec, size) = co_await async_read_until(chunked_buf_, CRCF);
          ec) {
        break;
      }

      size_t buf_size = chunked_buf_.size();
      size_t additional_size = buf_size - size;
      const char *data_ptr =
          asio::buffer_cast<const char *>(chunked_buf_.data());
      std::string_view size_str(data_ptr, size - CRCF.size());
      auto chunk_size = hex_to_int(size_str);
      chunked_buf_.consume(size);
      if (chunk_size < 0) {
        CINATRA_LOG_DEBUG << "bad chunked size";
        ec = asio::error::make_error_code(
            asio::error::basic_errors::invalid_argument);
        break;
      }

      if (additional_size < size_t(chunk_size + 2)) {
        // not a complete chunk, read left chunk data.
        size_t size_to_read = chunk_size + 2 - additional_size;
        if (std::tie(ec, size) =
                co_await async_read(chunked_buf_, size_to_read);
            ec) {
          break;
        }
      }

      if (chunk_size == 0) {
        // all finished, no more data
        chunked_buf_.consume(chunked_buf_.size());
        data.eof = true;
        break;
      }

      data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
      if (ctx.resp_body_stream) {
        std::tie(ec, size) = co_await ctx.resp_body_stream->async_write(
            {data_ptr, (size_t)chunk_size});
      }
      else {
        resp_chunk_str_.append(data_ptr, chunk_size);
      }

      chunked_buf_.consume(chunk_size + CRCF.size());
    }
    co_return ec;
  }